

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

void __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::
async_accept<asio::basic_socket<asio::ip::tcp,asio::any_io_executor>,std::function<void(std::error_code_const&)>,asio::any_io_executor>
          (reactive_socket_service<asio::ip::tcp> *this,implementation_type *impl,
          basic_socket<asio::ip::tcp,_asio::any_io_executor> *peer,endpoint_type *peer_endpoint,
          function<void_(const_std::error_code_&)> *handler,any_io_executor *io_ex)

{
  bool bVar1;
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
  *io_ex_00;
  reactor_op_cancellation *prVar2;
  reactive_socket_service_base *in_RSI;
  function<void_(const_std::error_code_&)> *in_RDI;
  basic_socket<asio::ip::tcp,_asio::any_io_executor> *in_R8;
  undefined8 in_R9;
  ptr p;
  associated_cancellation_slot_t<std::function<void_(const_std::error_code_&)>_> slot;
  bool is_continuation;
  function<void_(const_std::error_code_&)> *in_stack_ffffffffffffff18;
  function<void_(const_std::error_code_&)> *in_stack_ffffffffffffff20;
  undefined2 uVar3;
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
  *in_stack_ffffffffffffff30;
  basic_socket<asio::ip::tcp,_asio::any_io_executor> *in_stack_ffffffffffffff38;
  base_implementation_type *impl_00;
  undefined8 in_stack_ffffffffffffff40;
  error_code *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffff57;
  int *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
  *this_00;
  cancellation_slot local_48;
  undefined1 local_39;
  undefined2 uStack_32;
  basic_socket<asio::ip::tcp,_asio::any_io_executor> *local_30;
  reactive_socket_service_base *local_18;
  
  uStack_32 = (undefined2)((ulong)in_R9 >> 0x30);
  local_30 = in_R8;
  local_18 = in_RSI;
  local_39 = asio_handler_cont_helpers::is_continuation<std::function<void(std::error_code_const&)>>
                       ((function<void_(const_std::error_code_&)> *)0x7c9872);
  local_48.handler_ =
       (cancellation_handler_base **)
       get_associated_cancellation_slot<std::function<void(std::error_code_const&)>>
                 (in_stack_ffffffffffffff18);
  io_ex_00 = reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
             ::ptr::allocate(in_stack_ffffffffffffff20);
  uVar3 = uStack_32;
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
  ::reactive_socket_accept_op
            ((reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
              *)CONCAT17(in_stack_ffffffffffffff57,
                         CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
             in_stack_ffffffffffffff48,(socket_type)((ulong)in_stack_ffffffffffffff40 >> 0x20),
             (state_type)((ulong)in_stack_ffffffffffffff40 >> 0x18),in_stack_ffffffffffffff38,
             (tcp *)in_stack_ffffffffffffff30,
             (endpoint *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),in_RDI,
             (any_io_executor *)io_ex_00);
  this_00 = io_ex_00;
  bVar1 = cancellation_slot::is_connected(&local_48);
  if ((bVar1) &&
     (bVar1 = basic_socket<asio::ip::tcp,_asio::any_io_executor>::is_open(local_30), !bVar1)) {
    prVar2 = cancellation_slot::
             emplace<asio::detail::reactive_socket_service_base::reactor_op_cancellation,asio::detail::epoll_reactor*,asio::detail::epoll_reactor::descriptor_state**,int&,asio::detail::epoll_reactor::op_types>
                       ((cancellation_slot *)this_00,(epoll_reactor **)in_RDI,
                        (descriptor_state ***)CONCAT17(bVar1,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58,
                        (op_types *)
                        CONCAT17(in_stack_ffffffffffffff57,
                                 CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)));
    (io_ex_00->
    super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
    ).super_reactor_op.cancellation_key_ = prVar2;
  }
  impl_00 = (base_implementation_type *)((long)&in_RDI[1].super__Function_base._M_functor + 8);
  uVar4 = local_39;
  bVar1 = basic_socket<asio::ip::tcp,_asio::any_io_executor>::is_open(local_30);
  reactive_socket_service_base::
  start_accept_op<asio::detail::reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,asio::any_io_executor>,asio::ip::tcp,std::function<void(std::error_code_const&)>,asio::any_io_executor>>
            (local_18,impl_00,in_stack_ffffffffffffff30,SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0),
             local_30,(enable_if_t<is_same<typename_associated_immediate_executor<typename_reactive_socket_accept_op<basic_socket<tcp>,_tcp,_function<void_(const_error_code_&)>,_any_io_executor>::handler_type,_typename_reactive_socket_accept_op<basic_socket<tcp>,_tcp,_function<void_(const_error_code_&)>,_any_io_executor>::io_executor_type>::asio_associated_immediate_executor_is_unspecialised,_void>::value>
                       *)CONCAT17(bVar1,CONCAT16(uVar4,in_stack_ffffffffffffff50)));
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
  ::ptr::~ptr((ptr *)0x7c9a93);
  return;
}

Assistant:

void async_accept(implementation_type& impl, Socket& peer,
      endpoint_type* peer_endpoint, Handler& handler, const IoExecutor& io_ex)
  {
    bool is_continuation =
      asio_handler_cont_helpers::is_continuation(handler);

    associated_cancellation_slot_t<Handler> slot
      = asio::get_associated_cancellation_slot(handler);

    // Allocate and construct an operation to wrap the handler.
    typedef reactive_socket_accept_op<Socket, Protocol, Handler, IoExecutor> op;
    typename op::ptr p = { asio::detail::addressof(handler),
      op::ptr::allocate(handler), 0 };
    p.p = new (p.v) op(success_ec_, impl.socket_, impl.state_,
        peer, impl.protocol_, peer_endpoint, handler, io_ex);

    // Optionally register for per-operation cancellation.
    if (slot.is_connected() && !peer.is_open())
    {
      p.p->cancellation_key_ =
        &slot.template emplace<reactor_op_cancellation>(
            &reactor_, &impl.reactor_data_, impl.socket_, reactor::read_op);
    }

    ASIO_HANDLER_CREATION((reactor_.context(), *p.p, "socket",
          &impl, impl.socket_, "async_accept"));

    start_accept_op(impl, p.p, is_continuation, peer.is_open(), &io_ex, 0);
    p.v = p.p = 0;
  }